

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanTypeConversions.cpp
# Opt level: O1

VkCompareOp Diligent::ComparisonFuncToVkCompareOp(COMPARISON_FUNCTION CmpFunc)

{
  VkCompareOp VVar1;
  undefined7 in_register_00000039;
  string msg;
  string local_28;
  
  switch(CONCAT71(in_register_00000039,CmpFunc) & 0xffffffff) {
  case 0:
    FormatString<char[37]>(&local_28,(char (*) [37])"Comparison function is not specified");
    DebugAssertionFailed
              (local_28._M_dataplus._M_p,"ComparisonFuncToVkCompareOp",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
               ,0x2e4);
    goto LAB_002769ea;
  case 1:
    VVar1 = VK_COMPARE_OP_NEVER;
    break;
  case 2:
    VVar1 = VK_COMPARE_OP_LESS;
    break;
  case 3:
    VVar1 = VK_COMPARE_OP_EQUAL;
    break;
  case 4:
    VVar1 = VK_COMPARE_OP_LESS_OR_EQUAL;
    break;
  case 5:
    VVar1 = VK_COMPARE_OP_GREATER;
    break;
  case 6:
    VVar1 = VK_COMPARE_OP_NOT_EQUAL;
    break;
  case 7:
    VVar1 = VK_COMPARE_OP_GREATER_OR_EQUAL;
    break;
  case 8:
    goto switchD_0027695e_caseD_8;
  default:
    FormatString<char[28]>(&local_28,(char (*) [28])"Unknown comparison function");
    DebugAssertionFailed
              (local_28._M_dataplus._M_p,"ComparisonFuncToVkCompareOp",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
               ,0x2f2);
LAB_002769ea:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_28._M_dataplus._M_p != &local_28.field_2) {
      operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
    }
switchD_0027695e_caseD_8:
    VVar1 = VK_COMPARE_OP_ALWAYS;
  }
  return VVar1;
}

Assistant:

VkCompareOp ComparisonFuncToVkCompareOp(COMPARISON_FUNCTION CmpFunc)
{
    switch (CmpFunc)
    {
        // clang-format off
        case COMPARISON_FUNC_UNKNOWN:
            UNEXPECTED("Comparison function is not specified" );
            return VK_COMPARE_OP_ALWAYS;

        case COMPARISON_FUNC_NEVER:         return VK_COMPARE_OP_NEVER;
        case COMPARISON_FUNC_LESS:          return VK_COMPARE_OP_LESS;
        case COMPARISON_FUNC_EQUAL:         return VK_COMPARE_OP_EQUAL;
        case COMPARISON_FUNC_LESS_EQUAL:    return VK_COMPARE_OP_LESS_OR_EQUAL;
        case COMPARISON_FUNC_GREATER:       return VK_COMPARE_OP_GREATER;
        case COMPARISON_FUNC_NOT_EQUAL:     return VK_COMPARE_OP_NOT_EQUAL;
        case COMPARISON_FUNC_GREATER_EQUAL: return VK_COMPARE_OP_GREATER_OR_EQUAL;
        case COMPARISON_FUNC_ALWAYS:        return VK_COMPARE_OP_ALWAYS;
            // clang-format on

        default:
            UNEXPECTED("Unknown comparison function");
            return VK_COMPARE_OP_ALWAYS;
    }
}